

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArraySegment.cpp
# Opt level: O3

uint32 __thiscall
Js::SparseArraySegmentBase::RemoveUndefined
          (SparseArraySegmentBase *this,ScriptContext *scriptContext)

{
  RecyclableObject *libraryUndefined;
  undefined8 uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  Type *pTVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  
  if (this->length == 0) {
    return 0;
  }
  libraryUndefined =
       (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
       undefinedValue.ptr;
  uVar9 = this->length - 1;
  uVar12 = 0;
  uVar7 = 0;
LAB_00d4d848:
  uVar8 = (ulong)uVar9;
  if ((uint)uVar12 < uVar9) {
    bVar13 = true;
    while (*(undefined1 **)(&this[1].left + uVar12 * 2) != &DAT_40002fff80002) {
      BVar4 = JavascriptOperators::IsUndefinedObject
                        (*(undefined1 **)(&this[1].left + uVar12 * 2),libraryUndefined);
      if (BVar4 != 0) {
        uVar7 = uVar7 + 1;
        break;
      }
      uVar12 = uVar12 + 1;
      bVar13 = uVar12 < uVar8;
      if (uVar12 == uVar8) goto LAB_00d4d930;
    }
  }
  else {
    bVar13 = false;
  }
  uVar11 = (uint)uVar12;
  if (uVar11 < uVar9) {
    pTVar10 = &this[1].left + uVar8 * 2;
    uVar6 = uVar9;
    do {
      if (*(undefined1 **)pTVar10 != &DAT_40002fff80002) {
        BVar4 = JavascriptOperators::IsUndefinedObject(*(undefined1 **)pTVar10,libraryUndefined);
        if (BVar4 == 0) goto LAB_00d4d8c7;
        uVar7 = uVar7 + 1;
      }
      pTVar10 = pTVar10 + -2;
      uVar6 = uVar6 - 1;
      uVar9 = uVar11;
      if (uVar6 <= uVar11) goto LAB_00d4d930;
    } while( true );
  }
  if (uVar11 != uVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                ,0x6f,"(i == j)","i == j");
    if (!bVar3) goto LAB_00d4db12;
    *puVar5 = 0;
  }
LAB_00d4d930:
  if ((!bVar13) && (*(undefined1 **)(&this[1].left + (ulong)uVar9 * 2) != &DAT_40002fff80002)) {
    BVar4 = JavascriptOperators::IsUndefinedObject
                      (*(undefined1 **)(&this[1].left + (ulong)uVar9 * 2),libraryUndefined);
    if (BVar4 == 0) goto LAB_00d4d959;
    uVar7 = uVar7 + 1;
  }
  uVar9 = uVar9 - 1;
  goto LAB_00d4d959;
LAB_00d4d8c7:
  uVar1 = *(undefined8 *)pTVar10;
  Memory::Recycler::WBSetBit((char *)(&this[1].left + (uVar12 & 0xffffffff) * 2));
  *(undefined8 *)(&this[1].left + (uVar12 & 0xffffffff) * 2) = uVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this[1].left + (uVar12 & 0xffffffff) * 2);
  uVar9 = uVar6 - 1;
  uVar12 = (ulong)(uVar11 + 1);
  if (uVar9 <= uVar11) goto code_r0x00d4d90e;
  goto LAB_00d4d848;
code_r0x00d4d90e:
  uVar9 = uVar6 - 1;
LAB_00d4d959:
  uVar11 = this->length;
  if (uVar9 != uVar11 - 1) {
    uVar9 = uVar9 + 1;
    if (uVar11 <= uVar9) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                   ,0x7b,"(newLen < length)","newLen < length");
      if (!bVar13) goto LAB_00d4db12;
      *puVar5 = 0;
      uVar11 = this->length;
    }
    if (uVar11 - uVar9 < uVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                   ,0x7c,"(countUndefined <= length - newLen)",
                                   "countUndefined <= length - newLen");
      if (!bVar13) goto LAB_00d4db12;
      *puVar5 = 0;
    }
    SparseArraySegment<void_*>::Truncate((SparseArraySegment<void_*> *)this,uVar9 + this->left);
    uVar11 = this->length;
  }
  if (uVar11 <= this->size) {
    return uVar7;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar5 = 1;
  bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                               ,0x80,"(length <= size)","length <= size");
  if (bVar13) {
    *puVar5 = 0;
    return uVar7;
  }
LAB_00d4db12:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

uint32 SparseArraySegmentBase::RemoveUndefined(ScriptContext* scriptContext)
    {
        SparseArraySegment<Var> *_this = (SparseArraySegment<Var>*)this;
        // Shortcut length==0, otherwise the code below will AV when left==length==0. (WOOB 1114975)
        if (length == 0)
        {
            return 0;
        }

        //remove undefine values
        RecyclableObject *undefined = scriptContext->GetLibrary()->GetUndefined();

        uint32 i = 0;
        uint32 j = length - 1;
        uint32 countUndefined = 0;

        while (i <= j)
        {
            //get the first null/undefined slot from left
            while (i < j && !IsMissingOrUndefined(_this->elements[i], undefined, countUndefined))
            {
                i++;
            }
            bool iIsMissingOrUndefined = (i < j); // Flag to avoid test again if later j comes down to == i

            //get the first slot which is not null/undefined from the right
            while (i < j && IsMissingOrUndefined(_this->elements[j], undefined, countUndefined))
            {
                j--;
            }

            if (i < j)
            {
                //move
                _this->elements[i] = _this->elements[j];
                i++;
                j--;
            }
            else
            {
                Assert(i == j);
                if (iIsMissingOrUndefined || IsMissingOrUndefined(_this->elements[j], undefined, countUndefined))
                {
                    j--; // ok if j becomes -1. We'll truncate to length (j + 1).
                }
                break; // done
            }
        }

        if (j != length - 1) // Truncate if j has changed
        {
            uint32 newLen = j + 1;
            Assert(newLen < length);
            Assert(countUndefined <= length - newLen);

            _this->Truncate(left + newLen); // Truncate to new length (also clears moved elements)
        }
        AssertOrFailFast(length <= size);

        return countUndefined;
    }